

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void get_with_index_address_mode
               (m68k_info *info,cs_m68k_op *op,uint instruction,uint size,_Bool is_pc)

{
  byte bVar1;
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  uint in_EDX;
  long in_RSI;
  byte in_R8B;
  uint postindex;
  uint preindex;
  uint extension;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  bVar1 = in_R8B & 1;
  uVar2 = read_imm_16((m68k_info *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  *(undefined4 *)(in_RSI + 0x34) = 8;
  if ((uVar2 & 0x100) == 0) {
    iVar4 = 1;
    if ((uVar2 & 0x8000) != 0) {
      iVar4 = 9;
    }
    *(uint *)(in_RSI + 0xc) = iVar4 + (uVar2 >> 0xc & 7);
    *(bool *)(in_RSI + 0x22) = (uVar2 & 0x800) != 0;
    if ((uVar2 & 0xff) == 0) {
      if (bVar1 == 0) {
        *(uint *)(in_RSI + 8) = (in_EDX & 7) + 9;
      }
      else {
        *(undefined4 *)(in_RSI + 8) = 0x19;
        *(undefined4 *)(in_RSI + 0x34) = 0xd;
      }
    }
    else {
      if (bVar1 == 0) {
        *(uint *)(in_RSI + 8) = (in_EDX & 7) + 9;
        *(undefined4 *)(in_RSI + 0x34) = 7;
      }
      else {
        *(undefined4 *)(in_RSI + 8) = 0x19;
        *(undefined4 *)(in_RSI + 0x34) = 0xc;
      }
      *(short *)(in_RSI + 0x1c) = (short)(char)uVar2;
    }
    if ((uVar2 >> 9 & 3) != 0) {
      *(char *)(in_RSI + 0x1e) = (char)(1 << ((byte)(uVar2 >> 9) & 3));
    }
  }
  else {
    *(undefined4 *)(in_RSI + 8) = 0;
    *(undefined4 *)(in_RSI + 0xc) = 0;
    if ((uVar2 & 0x30) < 0x11) {
      local_30 = 0;
    }
    else {
      if ((uVar2 & 0x30) == 0x30) {
        local_2c = read_imm_32((m68k_info *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      }
      else {
        local_2c = read_imm_16((m68k_info *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      }
      local_30 = local_2c;
    }
    *(uint *)(in_RSI + 0x14) = local_30;
    if (((uVar2 & 3) < 2) || (0x43 < (uVar2 & 0x47))) {
      local_38 = 0;
    }
    else {
      if (((uVar2 & 3) == 3) && ((uVar2 & 0x47) < 0x44)) {
        local_34 = read_imm_32((m68k_info *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      }
      else {
        local_34 = read_imm_16((m68k_info *)
                               CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
      }
      local_38 = local_34;
    }
    *(uint *)(in_RSI + 0x18) = local_38;
    if ((uVar2 & 0x80) == 0) {
      if (bVar1 == 0) {
        *(uint *)(in_RSI + 8) = (in_EDX & 7) + 9;
      }
      else {
        *(undefined4 *)(in_RSI + 8) = 0x19;
      }
    }
    if ((uVar2 & 0x40) == 0) {
      if ((uVar2 & 0x8000) == 0) {
        *(uint *)(in_RSI + 0xc) = (uVar2 >> 0xc & 7) + 1;
      }
      else {
        *(uint *)(in_RSI + 0xc) = (uVar2 >> 0xc & 7) + 9;
      }
      *(bool *)(in_RSI + 0x22) = (uVar2 & 0x800) != 0;
      if ((uVar2 >> 9 & 3) != 0) {
        *(char *)(in_RSI + 0x1e) = (char)(1 << ((byte)(uVar2 >> 9) & 3));
      }
    }
    if ((uVar2 & 7) == 0 || 3 < (uVar2 & 7)) {
      if (4 < (uVar2 & 7)) {
        uVar3 = 9;
        if (bVar1 != 0) {
          uVar3 = 0xe;
        }
        *(undefined4 *)(in_RSI + 0x34) = uVar3;
      }
    }
    else {
      uVar3 = 10;
      if (bVar1 != 0) {
        uVar3 = 0xf;
      }
      *(undefined4 *)(in_RSI + 0x34) = uVar3;
    }
  }
  return;
}

Assistant:

static void get_with_index_address_mode(m68k_info *info, cs_m68k_op* op, uint instruction, uint size, bool is_pc)
{
	uint extension = read_imm_16(info);

	op->address_mode = M68K_AM_AREGI_INDEX_BASE_DISP;

	if (EXT_FULL(extension)) {
		uint preindex;
		uint postindex;

		op->mem.base_reg = M68K_REG_INVALID;
		op->mem.index_reg = M68K_REG_INVALID;

		/* Not sure how to deal with this?
		   if (EXT_EFFECTIVE_ZERO(extension)) {
		   strcpy(mode, "0");
		   break;
		   }
		 */

		op->mem.in_disp = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32(info) : read_imm_16(info)) : 0;
		op->mem.out_disp = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32(info) : read_imm_16(info)) : 0;

		if (EXT_BASE_REGISTER_PRESENT(extension)) {
			if (is_pc) {
				op->mem.base_reg = M68K_REG_PC;
			} else {
				op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			}
		}

		if (EXT_INDEX_REGISTER_PRESENT(extension)) {
			if (EXT_INDEX_AR(extension)) {
				op->mem.index_reg = M68K_REG_A0 + EXT_INDEX_REGISTER(extension);
			} else {
				op->mem.index_reg = M68K_REG_D0 + EXT_INDEX_REGISTER(extension);
			}

			op->mem.index_size = EXT_INDEX_LONG(extension) ? 1 : 0;

			if (EXT_INDEX_SCALE(extension)) {
				op->mem.scale = 1 << EXT_INDEX_SCALE(extension);
			}
		}

		preindex = (extension & 7) > 0 && (extension & 7) < 4;
		postindex = (extension & 7) > 4;

		if (preindex) {
			op->address_mode = is_pc ? M68K_AM_PC_MEMI_PRE_INDEX : M68K_AM_MEMI_PRE_INDEX;
		} else if (postindex) {
			op->address_mode = is_pc ? M68K_AM_PC_MEMI_POST_INDEX : M68K_AM_MEMI_POST_INDEX;
		}

		return;
	}

	op->mem.index_reg = (EXT_INDEX_AR(extension) ? M68K_REG_A0 : M68K_REG_D0) + EXT_INDEX_REGISTER(extension);
	op->mem.index_size = EXT_INDEX_LONG(extension) ? 1 : 0;

	if (EXT_8BIT_DISPLACEMENT(extension) == 0) {
		if (is_pc) {
			op->mem.base_reg = M68K_REG_PC;
			op->address_mode = M68K_AM_PCI_INDEX_BASE_DISP;
		} else {
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
		}
	} else {
		if (is_pc) {
			op->mem.base_reg = M68K_REG_PC;
			op->address_mode = M68K_AM_PCI_INDEX_8_BIT_DISP;
		} else {
			op->mem.base_reg = M68K_REG_A0 + (instruction & 7);
			op->address_mode = M68K_AM_AREGI_INDEX_8_BIT_DISP;
		}

		op->mem.disp = (int8_t)(extension & 0xff);
	}

	if (EXT_INDEX_SCALE(extension)) {
		op->mem.scale = 1 << EXT_INDEX_SCALE(extension);
	}
}